

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> __thiscall
duckdb::ReservoirSample::CreateNewSampleChunk
          (ReservoirSample *this,vector<duckdb::LogicalType,_true> *types,idx_t size)

{
  bool bVar1;
  DataChunk *pDVar2;
  Allocator *allocator;
  reference this_00;
  pointer pRVar3;
  reference pvVar4;
  idx_t in_RCX;
  size_type __n;
  
  pDVar2 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(pDVar2);
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)pDVar2;
  pDVar2 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
            operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                        *)this)->chunk;
  allocator = Allocator::DefaultAllocator();
  DataChunk::Initialize(pDVar2,allocator,(vector<duckdb::LogicalType,_true> *)size,in_RCX);
  if (*(long *)(size + 8) != *(long *)size) {
    __n = 0;
    do {
      this_00 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)size,__n);
      bVar1 = LogicalType::IsNumeric(this_00);
      if ((!bVar1) &&
         (*(char *)&types[2].super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                    .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start == '\x01')) {
        pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                               *)this);
        pvVar4 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)pRVar3,__n);
        Vector::SetVectorType(pvVar4,CONSTANT_VECTOR);
        pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                 ::operator->((unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                               *)this);
        pvVar4 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)pRVar3,__n);
        ConstantVector::SetNull(pvVar4,true);
      }
      __n = __n + 1;
    } while (__n < (ulong)((*(long *)(size + 8) - *(long *)size >> 3) * -0x5555555555555555));
  }
  return (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)
         (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)this;
}

Assistant:

unique_ptr<ReservoirChunk> ReservoirSample::CreateNewSampleChunk(vector<LogicalType> &types, idx_t size) const {
	auto new_sample_chunk = make_uniq<ReservoirChunk>();
	new_sample_chunk->chunk.Initialize(Allocator::DefaultAllocator(), types, size);

	// set the NULL columns correctly
	for (idx_t col_idx = 0; col_idx < types.size(); col_idx++) {
		if (!ValidSampleType(types[col_idx]) && stats_sample) {
			new_sample_chunk->chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(new_sample_chunk->chunk.data[col_idx], true);
		}
	}
	return new_sample_chunk;
}